

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O0

void GradientPredictDirect_SSE2(uint8_t *row,uint8_t *top,uint8_t *out,int length)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  int delta;
  __m128i H;
  __m128i G;
  __m128i F;
  __m128i E;
  __m128i C1;
  __m128i B1;
  __m128i A1;
  __m128i D;
  __m128i C0;
  __m128i B0;
  __m128i A0;
  __m128i zero;
  int i;
  int max_pos;
  undefined4 local_1bc;
  undefined1 local_d8;
  undefined1 uStack_d7;
  undefined1 uStack_d6;
  undefined1 uStack_d5;
  undefined1 uStack_d4;
  undefined1 uStack_d3;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  undefined1 local_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  undefined1 uStack_b4;
  undefined1 uStack_b3;
  undefined1 uStack_b2;
  undefined1 uStack_b1;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  undefined2 uStack_5e;
  undefined2 uStack_5c;
  undefined2 uStack_5a;
  undefined2 uStack_56;
  undefined2 uStack_54;
  undefined2 uStack_52;
  undefined2 uStack_4e;
  undefined2 uStack_4c;
  undefined2 uStack_4a;
  undefined1 local_18;
  undefined1 uStack_17;
  undefined1 uStack_16;
  undefined1 uStack_15;
  undefined1 uStack_14;
  undefined1 uStack_13;
  undefined1 uStack_12;
  undefined1 uStack_11;
  
  for (local_1bc = 0; local_1bc < (int)(in_ECX & 0xfffffff8); local_1bc = local_1bc + 8) {
    uVar1 = *(undefined8 *)(in_RDI + (local_1bc + -1));
    uVar2 = *(undefined8 *)(in_RSI + local_1bc);
    uVar3 = *(undefined8 *)(in_RSI + (local_1bc + -1));
    uVar4 = *(undefined8 *)(in_RDI + local_1bc);
    local_98 = (byte)uVar1;
    uStack_97 = (byte)((ulong)uVar1 >> 8);
    uStack_96 = (byte)((ulong)uVar1 >> 0x10);
    uStack_95 = (byte)((ulong)uVar1 >> 0x18);
    uStack_94 = (byte)((ulong)uVar1 >> 0x20);
    uStack_93 = (byte)((ulong)uVar1 >> 0x28);
    uStack_92 = (byte)((ulong)uVar1 >> 0x30);
    uStack_91 = (byte)((ulong)uVar1 >> 0x38);
    local_b8 = (byte)uVar2;
    uStack_b7 = (byte)((ulong)uVar2 >> 8);
    uStack_b6 = (byte)((ulong)uVar2 >> 0x10);
    uStack_b5 = (byte)((ulong)uVar2 >> 0x18);
    uStack_b4 = (byte)((ulong)uVar2 >> 0x20);
    uStack_b3 = (byte)((ulong)uVar2 >> 0x28);
    uStack_b2 = (byte)((ulong)uVar2 >> 0x30);
    uStack_b1 = (byte)((ulong)uVar2 >> 0x38);
    local_d8 = (byte)uVar3;
    uStack_d7 = (byte)((ulong)uVar3 >> 8);
    uStack_d6 = (byte)((ulong)uVar3 >> 0x10);
    uStack_d5 = (byte)((ulong)uVar3 >> 0x18);
    uStack_d4 = (byte)((ulong)uVar3 >> 0x20);
    uStack_d3 = (byte)((ulong)uVar3 >> 0x28);
    uStack_d2 = (byte)((ulong)uVar3 >> 0x30);
    uStack_d1 = (byte)((ulong)uVar3 >> 0x38);
    uStack_56 = (ushort)uStack_97;
    uStack_54 = (ushort)uStack_96;
    uStack_52 = (ushort)uStack_95;
    uStack_4e = (ushort)uStack_93;
    uStack_4c = (ushort)uStack_92;
    uStack_4a = (ushort)uStack_91;
    uStack_66 = (ushort)uStack_b7;
    uStack_64 = (ushort)uStack_b6;
    uStack_62 = (ushort)uStack_b5;
    uStack_5e = (ushort)uStack_b3;
    uStack_5c = (ushort)uStack_b2;
    uStack_5a = (ushort)uStack_b1;
    uStack_86 = (ushort)uStack_d7;
    uStack_84 = (ushort)uStack_d6;
    uStack_82 = (ushort)uStack_d5;
    uStack_7e = (ushort)uStack_d3;
    uStack_7c = (ushort)uStack_d2;
    uStack_7a = (ushort)uStack_d1;
    sVar6 = ((ushort)local_98 + (ushort)local_b8) - (ushort)local_d8;
    sVar7 = (uStack_56 + uStack_66) - uStack_86;
    sVar8 = (uStack_54 + uStack_64) - uStack_84;
    sVar9 = (uStack_52 + uStack_62) - uStack_82;
    sVar10 = ((ushort)uStack_94 + (ushort)uStack_b4) - (ushort)uStack_d4;
    sVar11 = (uStack_4e + uStack_5e) - uStack_7e;
    sVar12 = (uStack_4c + uStack_5c) - uStack_7c;
    sVar13 = (uStack_4a + uStack_5a) - uStack_7a;
    local_18 = (char)uVar4;
    uStack_17 = (char)((ulong)uVar4 >> 8);
    uStack_16 = (char)((ulong)uVar4 >> 0x10);
    uStack_15 = (char)((ulong)uVar4 >> 0x18);
    uStack_14 = (char)((ulong)uVar4 >> 0x20);
    uStack_13 = (char)((ulong)uVar4 >> 0x28);
    uStack_12 = (char)((ulong)uVar4 >> 0x30);
    uStack_11 = (char)((ulong)uVar4 >> 0x38);
    *(ulong *)(in_RDX + local_1bc) =
         CONCAT17(uStack_11 - ((0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13)),
                  CONCAT16(uStack_12 -
                           ((0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12)),
                           CONCAT15(uStack_13 -
                                    ((0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 -
                                    (0xff < sVar11)),
                                    CONCAT14(uStack_14 -
                                             ((0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 -
                                             (0xff < sVar10)),
                                             CONCAT13(uStack_15 -
                                                      ((0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 -
                                                      (0xff < sVar9)),
                                                      CONCAT12(uStack_16 -
                                                               ((0 < sVar8) * (sVar8 < 0x100) *
                                                                (char)sVar8 - (0xff < sVar8)),
                                                               CONCAT11(uStack_17 -
                                                                        ((0 < sVar7) *
                                                                         (sVar7 < 0x100) *
                                                                         (char)sVar7 -
                                                                        (0xff < sVar7)),
                                                                        local_18 -
                                                                        ((0 < sVar6) *
                                                                         (sVar6 < 0x100) *
                                                                         (char)sVar6 -
                                                                        (0xff < sVar6)))))))));
  }
  for (; local_1bc < (int)in_ECX; local_1bc = local_1bc + 1) {
    iVar5 = GradientPredictor_SSE2
                      (*(uint8_t *)(in_RDI + (local_1bc + -1)),*(uint8_t *)(in_RSI + local_1bc),
                       *(uint8_t *)(in_RSI + (local_1bc + -1)));
    *(char *)(in_RDX + local_1bc) = *(char *)(in_RDI + local_1bc) - (char)iVar5;
  }
  return;
}

Assistant:

static void GradientPredictDirect_SSE2(const uint8_t* const row,
                                       const uint8_t* const top,
                                       uint8_t* WEBP_RESTRICT const out,
                                       int length) {
  const int max_pos = length & ~7;
  int i;
  const __m128i zero = _mm_setzero_si128();
  for (i = 0; i < max_pos; i += 8) {
    const __m128i A0 = _mm_loadl_epi64((const __m128i*)&row[i - 1]);
    const __m128i B0 = _mm_loadl_epi64((const __m128i*)&top[i]);
    const __m128i C0 = _mm_loadl_epi64((const __m128i*)&top[i - 1]);
    const __m128i D = _mm_loadl_epi64((const __m128i*)&row[i]);
    const __m128i A1 = _mm_unpacklo_epi8(A0, zero);
    const __m128i B1 = _mm_unpacklo_epi8(B0, zero);
    const __m128i C1 = _mm_unpacklo_epi8(C0, zero);
    const __m128i E = _mm_add_epi16(A1, B1);
    const __m128i F = _mm_sub_epi16(E, C1);
    const __m128i G = _mm_packus_epi16(F, zero);
    const __m128i H = _mm_sub_epi8(D, G);
    _mm_storel_epi64((__m128i*)(out + i), H);
  }
  for (; i < length; ++i) {
    const int delta = GradientPredictor_SSE2(row[i - 1], top[i], top[i - 1]);
    out[i] = (uint8_t)(row[i] - delta);
  }
}